

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cpp
# Opt level: O3

int ncnn::eval_list_expression
              (string *expr,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *blobs,
              vector<int,_std::allocator<int>_> *outlist)

{
  pointer pcVar1;
  byte bVar2;
  byte bVar3;
  pointer pMVar4;
  iterator iVar5;
  float fVar6;
  _Elt_pointer ptVar7;
  vector<int,std::allocator<int>> *this;
  int iVar8;
  int iVar9;
  ulong uVar10;
  _Elt_pointer ptVar11;
  anon_union_4_2_947300a4_for_typed_value_1 aVar12;
  anon_union_4_2_947300a4_for_typed_value_1 aVar13;
  ncnn *pnVar14;
  ulong uVar15;
  uint uVar16;
  anon_union_4_2_947300a4_for_typed_value_1 aVar17;
  ncnn *this_00;
  uint uVar18;
  long lVar19;
  float fVar20;
  int size;
  stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
  exprstack;
  float vf;
  int vi;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  typed_value local_ec;
  anon_union_4_2_947300a4_for_typed_value_1 local_e4;
  ncnn *local_e0;
  undefined1 local_d8 [16];
  float local_bc;
  undefined1 local_b8 [32];
  _Elt_pointer local_98;
  _Map_pointer pptStack_90;
  _Elt_pointer local_88;
  _Elt_pointer ptStack_80;
  _Elt_pointer local_78;
  _Map_pointer pptStack_70;
  float local_60;
  float local_5c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  vector<int,std::allocator<int>> *local_40;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_38;
  
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar1 = local_b8 + 0x10;
  local_b8._8_8_ = 0;
  local_b8._16_8_ = local_b8._16_8_ & 0xffffffffffffff00;
  local_b8._0_8_ = pcVar1;
  local_40 = (vector<int,std::allocator<int>> *)outlist;
  local_38 = blobs;
  if (expr->_M_string_length != 0) {
    uVar15 = 0;
    do {
      uVar10 = (ulong)(byte)(expr->_M_dataplus)._M_p[uVar15];
      if ((uVar10 < 0x2d) && ((0x130000000000U >> (uVar10 & 0x3f) & 1) != 0)) {
        if (local_b8._8_8_ != 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_58,(value_type *)local_b8);
          local_b8._8_8_ = 0;
          *(char *)local_b8._0_8_ = '\0';
        }
      }
      else {
        std::__cxx11::string::push_back((char)(value_type *)local_b8);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 < expr->_M_string_length);
    if (local_b8._8_8_ != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_58,(value_type *)local_b8);
    }
  }
  if ((pointer)local_b8._0_8_ != pcVar1) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
  }
  local_78 = (_Elt_pointer)0x0;
  pptStack_70 = (_Map_pointer)0x0;
  local_88 = (_Elt_pointer)0x0;
  ptStack_80 = (_Elt_pointer)0x0;
  local_98 = (_Elt_pointer)0x0;
  pptStack_90 = (_Map_pointer)0x0;
  local_b8._16_8_ = (void *)0x0;
  local_b8._24_8_ = 0;
  local_b8._0_8_ = (pointer)0x0;
  local_b8._8_8_ = 0;
  std::_Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>::_M_initialize_map
            ((_Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_> *)local_b8,0);
  uVar18 = (uint)((ulong)((long)local_58.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_58.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 5);
  if (0 < (int)uVar18) {
    uVar10 = (ulong)(uVar18 & 0x7fffffff);
    uVar15 = uVar10 + 1;
    lVar19 = uVar10 << 5;
    do {
      pnVar14 = (ncnn *)((long)&local_58.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1]._M_dataplus._M_p +
                        lVar19);
      if (*(long *)((long)&local_58.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length + lVar19)
          != 2) {
LAB_005bbeed:
        iVar8 = std::__cxx11::string::compare((char *)pnVar14);
        local_e0 = pnVar14;
        if ((iVar8 == 0) ||
           ((((iVar8 = std::__cxx11::string::compare((char *)pnVar14), iVar8 == 0 ||
              (iVar8 = std::__cxx11::string::compare((char *)pnVar14), iVar8 == 0)) ||
             (iVar8 = std::__cxx11::string::compare((char *)pnVar14), iVar8 == 0)) ||
            ((iVar8 = std::__cxx11::string::compare((char *)pnVar14), iVar8 == 0 ||
             (iVar8 = std::__cxx11::string::compare((char *)pnVar14), iVar8 == 0)))))) {
          if (local_88 == ptStack_80) {
            iVar8 = pptStack_70[-1][0x3f].type;
            aVar12 = (anon_union_4_2_947300a4_for_typed_value_1)pptStack_70[-1][0x3f].field_1.i;
            operator_delete(ptStack_80,0x200);
            ptStack_80 = pptStack_70[-1];
            local_78 = ptStack_80 + 0x40;
            ptVar11 = ptStack_80 + 0x3f;
            pptStack_70 = pptStack_70 + -1;
LAB_005bc461:
            local_88 = ptVar11 + -1;
            iVar9 = ptVar11[-1].type;
            aVar13 = (anon_union_4_2_947300a4_for_typed_value_1)ptVar11[-1].field_1.i;
          }
          else {
            ptVar11 = local_88 + -1;
            iVar8 = local_88[-1].type;
            aVar12 = (anon_union_4_2_947300a4_for_typed_value_1)local_88[-1].field_1.i;
            if (ptVar11 != ptStack_80) goto LAB_005bc461;
            iVar9 = pptStack_70[-1][0x3f].type;
            aVar13 = (anon_union_4_2_947300a4_for_typed_value_1)pptStack_70[-1][0x3f].field_1.i;
            local_88 = ptVar11;
            operator_delete(ptStack_80,0x200);
            ptStack_80 = pptStack_70[-1];
            local_78 = ptStack_80 + 0x40;
            local_88 = ptStack_80 + 0x3f;
            pptStack_70 = pptStack_70 + -1;
          }
          pnVar14 = local_e0;
          if (iVar8 == 0 && iVar9 == 0) {
            iVar8 = std::__cxx11::string::compare((char *)local_e0);
            if (iVar8 == 0) {
              local_ec.field_1.i = aVar13.i + aVar12.i;
            }
            else {
              iVar8 = std::__cxx11::string::compare((char *)pnVar14);
              if (iVar8 == 0) {
                local_ec.field_1.i = aVar12.i - aVar13.i;
              }
              else {
                iVar8 = std::__cxx11::string::compare((char *)pnVar14);
                if (iVar8 == 0) {
                  local_ec.field_1.i = aVar13.i * aVar12.i;
                }
                else {
                  iVar8 = std::__cxx11::string::compare((char *)pnVar14);
                  if (iVar8 == 0) {
                    if ((float)aVar13.i == 0.0) {
                      eval_list_expression();
                      goto LAB_005bd3ac;
                    }
                    local_ec.field_1.i = aVar12.i / aVar13.i;
                  }
                  else {
                    iVar8 = std::__cxx11::string::compare((char *)pnVar14);
                    local_ec.field_1 = aVar13;
                    if (iVar8 == 0) {
                      if (aVar13.i < aVar12.i) {
                        local_ec.field_1 = aVar12;
                      }
                    }
                    else if (aVar12.i <= aVar13.i) {
                      local_ec.field_1 = aVar12;
                    }
                  }
                }
              }
            }
            local_ec.type = 0;
            std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>::
            emplace_back<ncnn::typed_value>
                      ((deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_> *)local_b8,
                       &local_ec);
          }
          else {
            local_e4 = aVar12;
            if (iVar8 == 0) {
              local_e4.f = (float)aVar12.i;
            }
            if (iVar9 == 0) {
              aVar13.f = (float)aVar13.i;
            }
            local_d8._0_4_ = aVar13.i;
            iVar8 = std::__cxx11::string::compare((char *)local_e0);
            if (iVar8 == 0) {
              local_ec.field_1.f = (float)local_d8._0_4_ + local_e4.f;
            }
            else {
              iVar8 = std::__cxx11::string::compare((char *)pnVar14);
              if (iVar8 == 0) {
                local_ec.field_1.f = local_e4.f - (float)local_d8._0_4_;
              }
              else {
                iVar8 = std::__cxx11::string::compare((char *)pnVar14);
                if (iVar8 == 0) {
                  local_ec.field_1.f = (float)local_d8._0_4_ * local_e4.f;
                }
                else {
                  iVar8 = std::__cxx11::string::compare((char *)pnVar14);
                  if (iVar8 == 0) {
                    local_ec.field_1.f = floorf(local_e4.f / (float)local_d8._0_4_);
                  }
                  else {
                    iVar8 = std::__cxx11::string::compare((char *)pnVar14);
                    local_ec.field_1 = (anon_union_4_2_947300a4_for_typed_value_1)local_d8._0_4_;
                    if (iVar8 == 0) {
                      if ((float)local_d8._0_4_ <= local_e4.f) {
                        local_ec.field_1 = local_e4;
                      }
                    }
                    else if (local_e4.f <= (float)local_d8._0_4_) {
                      local_ec.field_1 = local_e4;
                    }
                  }
                }
              }
            }
            local_ec.type = 1;
            std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>::
            emplace_back<ncnn::typed_value>
                      ((deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_> *)local_b8,
                       &local_ec);
          }
        }
        else {
          iVar8 = std::__cxx11::string::compare((char *)pnVar14);
          if (((iVar8 == 0) || (iVar8 = std::__cxx11::string::compare((char *)pnVar14), iVar8 == 0))
             || ((iVar8 = std::__cxx11::string::compare((char *)pnVar14), iVar8 == 0 ||
                 (iVar8 = std::__cxx11::string::compare((char *)pnVar14), iVar8 == 0)))) {
            if (local_88 == ptStack_80) {
              iVar8 = pptStack_70[-1][0x3f].type;
              aVar12 = (anon_union_4_2_947300a4_for_typed_value_1)pptStack_70[-1][0x3f].field_1.i;
              operator_delete(ptStack_80,0x200);
              ptStack_80 = pptStack_70[-1];
              local_78 = ptStack_80 + 0x40;
              ptVar11 = ptStack_80 + 0x3f;
              pptStack_70 = pptStack_70 + -1;
            }
            else {
              ptVar11 = local_88 + -1;
              iVar8 = local_88[-1].type;
              aVar12 = (anon_union_4_2_947300a4_for_typed_value_1)local_88[-1].field_1.i;
            }
            pnVar14 = local_e0;
            local_88 = ptVar11;
            if (iVar8 == 0) {
              iVar8 = std::__cxx11::string::compare((char *)local_e0);
              if (iVar8 == 0) {
                local_ec.field_1.i = -aVar12.i;
                if (0 < aVar12.i) {
                  local_ec.field_1 = aVar12;
                }
              }
              else {
                iVar8 = std::__cxx11::string::compare((char *)pnVar14);
                if (iVar8 == 0) {
                  local_ec.field_1.i = -aVar12.i;
                }
                else {
                  iVar8 = std::__cxx11::string::compare((char *)pnVar14);
                  if (iVar8 == 0) {
                    local_ec.field_1.i = -(uint)((float)aVar12.i != 0.0);
                    if (0 < aVar12.i) {
                      local_ec.field_1.i = 1;
                    }
                  }
                  else {
                    local_ec.field_1.i = aVar12.i * aVar12.i;
                  }
                }
              }
              local_ec.type = 0;
              std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>::
              emplace_back<ncnn::typed_value>
                        ((deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_> *)local_b8,
                         &local_ec);
            }
            else {
              local_d8 = ZEXT416((uint)aVar12.i);
              iVar8 = std::__cxx11::string::compare((char *)local_e0);
              if (iVar8 == 0) {
                local_ec.field_1.i = local_d8._0_4_ & 0x7fffffff;
              }
              else {
                iVar8 = std::__cxx11::string::compare((char *)pnVar14);
                if (iVar8 == 0) {
                  local_ec.field_1.i = local_d8._0_4_ ^ 0x80000000;
                }
                else {
                  iVar8 = std::__cxx11::string::compare((char *)pnVar14);
                  if (iVar8 == 0) {
                    local_ec.field_1.i =
                         -(uint)(0.0 < (float)local_d8._0_4_) & 0x3f800000 |
                         ~-(uint)(0.0 < (float)local_d8._0_4_) &
                         -(uint)((float)local_d8._0_4_ != 0.0) & 0xbf800000;
                  }
                  else {
                    local_ec.field_1.f = (float)local_d8._0_4_ * (float)local_d8._0_4_;
                  }
                }
              }
              local_ec.type = 1;
              std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>::
              emplace_back<ncnn::typed_value>
                        ((deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_> *)local_b8,
                         &local_ec);
            }
          }
          else {
            iVar8 = std::__cxx11::string::compare((char *)pnVar14);
            if ((((iVar8 == 0) ||
                 (iVar8 = std::__cxx11::string::compare((char *)pnVar14), iVar8 == 0)) ||
                (iVar8 = std::__cxx11::string::compare((char *)pnVar14), iVar8 == 0)) ||
               (iVar8 = std::__cxx11::string::compare((char *)pnVar14), iVar8 == 0)) {
              if (local_88 == ptStack_80) {
                iVar8 = pptStack_70[-1][0x3f].type;
                local_d8._0_4_ = pptStack_70[-1][0x3f].field_1.i;
                operator_delete(ptStack_80,0x200);
                ptStack_80 = pptStack_70[-1];
                local_78 = ptStack_80 + 0x40;
                ptVar11 = ptStack_80 + 0x3f;
                aVar12 = (anon_union_4_2_947300a4_for_typed_value_1)local_d8._0_4_;
                pptStack_70 = pptStack_70 + -1;
              }
              else {
                ptVar11 = local_88 + -1;
                iVar8 = local_88[-1].type;
                aVar12.i = local_88[-1].field_1.i;
              }
              pnVar14 = local_e0;
              local_88 = ptVar11;
              if (iVar8 == 0) {
                local_ec.type = 0;
                local_ec.field_1 = aVar12;
                std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>::
                emplace_back<ncnn::typed_value>
                          ((deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_> *)local_b8,
                           &local_ec);
              }
              else {
                local_d8._0_4_ = aVar12.i;
                iVar8 = std::__cxx11::string::compare((char *)local_e0);
                if (iVar8 == 0) {
                  fVar20 = (float)local_d8._0_4_;
                }
                else {
                  iVar8 = std::__cxx11::string::compare((char *)pnVar14);
                  if (iVar8 == 0) {
                    fVar20 = ceilf((float)local_d8._0_4_);
                  }
                  else {
                    iVar8 = std::__cxx11::string::compare((char *)pnVar14);
                    if (iVar8 == 0) {
                      fVar20 = floorf((float)local_d8._0_4_);
                    }
                    else {
                      fVar20 = roundf((float)local_d8._0_4_);
                    }
                  }
                }
                local_ec.field_1.i = (int)fVar20;
                local_ec.type = 0;
                std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>::
                emplace_back<ncnn::typed_value>
                          ((deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_> *)local_b8,
                           &local_ec);
              }
            }
            else {
              iVar8 = std::__cxx11::string::compare((char *)pnVar14);
              if ((((iVar8 == 0) ||
                   (iVar8 = std::__cxx11::string::compare((char *)pnVar14), iVar8 == 0)) ||
                  ((((iVar8 = std::__cxx11::string::compare((char *)pnVar14), iVar8 == 0 ||
                     ((iVar8 = std::__cxx11::string::compare((char *)pnVar14), iVar8 == 0 ||
                      (iVar8 = std::__cxx11::string::compare((char *)pnVar14), iVar8 == 0)))) ||
                    (iVar8 = std::__cxx11::string::compare((char *)pnVar14), iVar8 == 0)) ||
                   (((iVar8 = std::__cxx11::string::compare((char *)pnVar14), iVar8 == 0 ||
                     (iVar8 = std::__cxx11::string::compare((char *)pnVar14), iVar8 == 0)) ||
                    (iVar8 = std::__cxx11::string::compare((char *)pnVar14), iVar8 == 0)))))) ||
                 (((((iVar8 = std::__cxx11::string::compare((char *)pnVar14), iVar8 == 0 ||
                     (iVar8 = std::__cxx11::string::compare((char *)pnVar14), iVar8 == 0)) ||
                    ((iVar8 = std::__cxx11::string::compare((char *)pnVar14), iVar8 == 0 ||
                     ((iVar8 = std::__cxx11::string::compare((char *)pnVar14), iVar8 == 0 ||
                      (iVar8 = std::__cxx11::string::compare((char *)pnVar14), iVar8 == 0)))))) ||
                   (iVar8 = std::__cxx11::string::compare((char *)pnVar14), iVar8 == 0)) ||
                  ((((iVar8 = std::__cxx11::string::compare((char *)pnVar14), iVar8 == 0 ||
                     (iVar8 = std::__cxx11::string::compare((char *)pnVar14), iVar8 == 0)) ||
                    (iVar8 = std::__cxx11::string::compare((char *)pnVar14), iVar8 == 0)) ||
                   (iVar8 = std::__cxx11::string::compare((char *)pnVar14), iVar8 == 0)))))) {
                if (local_88 == ptStack_80) {
                  iVar8 = pptStack_70[-1][0x3f].type;
                  fVar20 = (float)pptStack_70[-1][0x3f].field_1.i;
                  operator_delete(ptStack_80,0x200);
                  ptStack_80 = pptStack_70[-1];
                  local_78 = ptStack_80 + 0x40;
                  ptVar11 = ptStack_80 + 0x3f;
                  pptStack_70 = pptStack_70 + -1;
                }
                else {
                  ptVar11 = local_88 + -1;
                  iVar8 = local_88[-1].type;
                  fVar20 = (float)local_88[-1].field_1.i;
                }
                pnVar14 = local_e0;
                if (iVar8 == 0) {
                  fVar20 = (float)(int)fVar20;
                }
                local_d8._0_4_ = fVar20;
                local_88 = ptVar11;
                iVar8 = std::__cxx11::string::compare((char *)local_e0);
                if (iVar8 == 0) {
                  local_ec.field_1.f = acosf((float)local_d8._0_4_);
                }
                else {
                  iVar8 = std::__cxx11::string::compare((char *)pnVar14);
                  if (iVar8 == 0) {
                    local_ec.field_1.f = acoshf((float)local_d8._0_4_);
                  }
                  else {
                    iVar8 = std::__cxx11::string::compare((char *)pnVar14);
                    if (iVar8 == 0) {
                      local_ec.field_1.f = asinf((float)local_d8._0_4_);
                    }
                    else {
                      iVar8 = std::__cxx11::string::compare((char *)pnVar14);
                      if (iVar8 == 0) {
                        local_ec.field_1.f = asinhf((float)local_d8._0_4_);
                      }
                      else {
                        iVar8 = std::__cxx11::string::compare((char *)pnVar14);
                        if (iVar8 == 0) {
                          local_ec.field_1.f = atanf((float)local_d8._0_4_);
                        }
                        else {
                          iVar8 = std::__cxx11::string::compare((char *)pnVar14);
                          if (iVar8 == 0) {
                            local_ec.field_1.f = atanhf((float)local_d8._0_4_);
                          }
                          else {
                            iVar8 = std::__cxx11::string::compare((char *)pnVar14);
                            if (iVar8 == 0) {
                              local_ec.field_1.f = cosf((float)local_d8._0_4_);
                            }
                            else {
                              iVar8 = std::__cxx11::string::compare((char *)pnVar14);
                              if (iVar8 == 0) {
                                local_ec.field_1.f = coshf((float)local_d8._0_4_);
                              }
                              else {
                                iVar8 = std::__cxx11::string::compare((char *)pnVar14);
                                if (iVar8 == 0) {
                                  local_ec.field_1.f = erff((float)local_d8._0_4_);
                                }
                                else {
                                  iVar8 = std::__cxx11::string::compare((char *)pnVar14);
                                  if (iVar8 == 0) {
                                    local_ec.field_1.f = expf((float)local_d8._0_4_);
                                  }
                                  else {
                                    iVar8 = std::__cxx11::string::compare((char *)pnVar14);
                                    if (iVar8 == 0) {
                                      local_ec.field_1.f = logf((float)local_d8._0_4_);
                                    }
                                    else {
                                      iVar8 = std::__cxx11::string::compare((char *)pnVar14);
                                      if (iVar8 == 0) {
                                        local_ec.field_1.f = log10f((float)local_d8._0_4_);
                                      }
                                      else {
                                        iVar8 = std::__cxx11::string::compare((char *)pnVar14);
                                        if (iVar8 == 0) {
                                          local_ec.field_1.f = 1.0 / (float)local_d8._0_4_;
                                        }
                                        else {
                                          iVar8 = std::__cxx11::string::compare((char *)pnVar14);
                                          if (iVar8 == 0) {
                                            local_ec.field_1.f = 1.0 / SQRT((float)local_d8._0_4_);
                                          }
                                          else {
                                            iVar8 = std::__cxx11::string::compare((char *)local_e0);
                                            if (iVar8 == 0) {
                                              local_ec.field_1.f = sinf((float)local_d8._0_4_);
                                            }
                                            else {
                                              iVar8 = std::__cxx11::string::compare
                                                                ((char *)local_e0);
                                              if (iVar8 == 0) {
                                                local_ec.field_1.f = sinhf((float)local_d8._0_4_);
                                              }
                                              else {
                                                iVar8 = std::__cxx11::string::compare
                                                                  ((char *)local_e0);
                                                if (iVar8 == 0) {
                                                  local_ec.field_1.f = SQRT((float)local_d8._0_4_);
                                                }
                                                else {
                                                  iVar8 = std::__cxx11::string::compare
                                                                    ((char *)local_e0);
                                                  if (iVar8 == 0) {
                                                    local_ec.field_1.f = tanf((float)local_d8._0_4_)
                                                    ;
                                                  }
                                                  else {
                                                    local_ec.field_1.f =
                                                         tanhf((float)local_d8._0_4_);
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
                local_ec.type = 1;
                std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>::
                emplace_back<ncnn::typed_value>
                          ((deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_> *)local_b8,
                           &local_ec);
              }
              else {
                local_d8._0_8_ = uVar15;
                iVar8 = std::__cxx11::string::compare((char *)pnVar14);
                if (((iVar8 == 0) ||
                    (iVar8 = std::__cxx11::string::compare((char *)local_e0), iVar8 == 0)) ||
                   (((iVar8 = std::__cxx11::string::compare((char *)local_e0), iVar8 == 0 ||
                     ((iVar8 = std::__cxx11::string::compare((char *)local_e0), iVar8 == 0 ||
                      (iVar8 = std::__cxx11::string::compare((char *)local_e0), iVar8 == 0)))) ||
                    (iVar8 = std::__cxx11::string::compare((char *)local_e0), iVar8 == 0)))) {
                  if (local_88 == ptStack_80) {
                    iVar8 = pptStack_70[-1][0x3f].type;
                    fVar20 = pptStack_70[-1][0x3f].field_1.f;
                    operator_delete(ptStack_80,0x200);
                    ptStack_80 = pptStack_70[-1];
                    local_78 = ptStack_80 + 0x40;
                    ptVar11 = ptStack_80 + 0x3f;
                    pptStack_70 = pptStack_70 + -1;
LAB_005bceab:
                    local_88 = ptVar11 + -1;
                    iVar9 = ptVar11[-1].type;
                    aVar12 = (anon_union_4_2_947300a4_for_typed_value_1)ptVar11[-1].field_1.f;
                  }
                  else {
                    ptVar11 = local_88 + -1;
                    iVar8 = local_88[-1].type;
                    fVar20 = local_88[-1].field_1.f;
                    if (ptVar11 != ptStack_80) goto LAB_005bceab;
                    iVar9 = pptStack_70[-1][0x3f].type;
                    aVar12 = (anon_union_4_2_947300a4_for_typed_value_1)
                             pptStack_70[-1][0x3f].field_1.f;
                    local_88 = ptVar11;
                    operator_delete(ptStack_80,0x200);
                    ptStack_80 = pptStack_70[-1];
                    local_78 = ptStack_80 + 0x40;
                    local_88 = ptStack_80 + 0x3f;
                    pptStack_70 = pptStack_70 + -1;
                  }
                  local_bc = fVar20;
                  if (iVar8 == 0) {
                    local_bc = (float)(int)fVar20;
                  }
                  local_e4 = aVar12;
                  if (iVar9 == 0) {
                    local_e4.f = (float)aVar12.i;
                  }
                  iVar8 = std::__cxx11::string::compare((char *)local_e0);
                  if (iVar8 == 0) {
                    local_ec.field_1.f = local_bc / local_e4.f;
                  }
                  else {
                    iVar8 = std::__cxx11::string::compare((char *)local_e0);
                    if (iVar8 == 0) {
                      local_ec.field_1.f = atan2f(local_bc,local_e4.f);
                    }
                    else {
                      iVar8 = std::__cxx11::string::compare((char *)local_e0);
                      if (iVar8 == 0) {
                        local_ec.field_1.f = fmodf(local_bc,local_e4.f);
                      }
                      else {
                        iVar8 = std::__cxx11::string::compare((char *)local_e0);
                        if (iVar8 == 0) {
                          local_ec.field_1.f = powf(local_bc,local_e4.f);
                        }
                        else {
                          iVar8 = std::__cxx11::string::compare((char *)local_e0);
                          if (iVar8 == 0) {
                            local_ec.field_1.f = fmodf(local_bc,local_e4.f);
                            if (local_bc * local_e4.f < 0.0) {
                              local_ec.field_1.f = local_ec.field_1.f + local_e4.f;
                            }
                          }
                          else {
                            fVar20 = expf(local_bc);
                            local_e0 = (ncnn *)CONCAT44(local_e0._4_4_,fVar20);
                            fVar20 = expf(local_e4.f);
                            local_ec.field_1.f = logf(fVar20 + local_e0._0_4_);
                          }
                        }
                      }
                    }
                  }
                  local_ec.type = 1;
                  std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>::
                  emplace_back<ncnn::typed_value>
                            ((deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_> *)
                             local_b8,&local_ec);
                }
                else {
                  iVar8 = std::__cxx11::string::compare((char *)local_e0);
                  if ((((iVar8 == 0) ||
                       (iVar8 = std::__cxx11::string::compare((char *)local_e0), iVar8 == 0)) ||
                      (iVar8 = std::__cxx11::string::compare((char *)local_e0), iVar8 == 0)) ||
                     ((iVar8 = std::__cxx11::string::compare((char *)local_e0), iVar8 == 0 ||
                      (iVar8 = std::__cxx11::string::compare((char *)local_e0), pnVar14 = local_e0,
                      iVar8 == 0)))) {
                    if (local_88 == ptStack_80) {
                      uVar18 = pptStack_70[-1][0x3f].field_1.i;
                      operator_delete(ptStack_80,0x200);
                      ptStack_80 = pptStack_70[-1];
                      local_78 = ptStack_80 + 0x40;
                      local_88 = ptStack_80 + 0x3f;
                      pptStack_70 = pptStack_70 + -1;
LAB_005bd110:
                      uVar16 = local_88[-1].field_1.i;
                      local_88 = local_88 + -1;
                    }
                    else {
                      uVar18 = local_88[-1].field_1.i;
                      local_88 = local_88 + -1;
                      if (local_88 != ptStack_80) goto LAB_005bd110;
                      uVar16 = pptStack_70[-1][0x3f].field_1.i;
                      operator_delete(ptStack_80,0x200);
                      ptStack_80 = pptStack_70[-1];
                      local_78 = ptStack_80 + 0x40;
                      local_88 = ptStack_80 + 0x3f;
                      pptStack_70 = pptStack_70 + -1;
                    }
                    iVar8 = std::__cxx11::string::compare((char *)local_e0);
                    if (iVar8 == 0) {
                      local_ec.field_1.i = uVar16 & uVar18;
                    }
                    else {
                      iVar8 = std::__cxx11::string::compare((char *)local_e0);
                      if (iVar8 == 0) {
                        local_ec.field_1.i = uVar16 | uVar18;
                      }
                      else {
                        iVar8 = std::__cxx11::string::compare((char *)local_e0);
                        if (iVar8 == 0) {
                          local_ec.field_1.i = uVar16 ^ uVar18;
                        }
                        else {
                          iVar8 = std::__cxx11::string::compare((char *)local_e0);
                          if (iVar8 == 0) {
                            local_ec.field_1.i = uVar18 << ((byte)uVar16 & 0x1f);
                          }
                          else {
                            local_ec.field_1.i = (int)uVar18 >> ((byte)uVar16 & 0x1f);
                          }
                        }
                      }
                    }
                    local_ec.type = 0;
                    std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>::
                    emplace_back<ncnn::typed_value>
                              ((deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_> *)
                               local_b8,&local_ec);
                  }
                  else {
                    iVar8 = __isoc99_sscanf(*(undefined8 *)local_e0,"%d",&local_5c);
                    iVar9 = __isoc99_sscanf(*(undefined8 *)pnVar14,"%f",&local_60);
                    if (iVar9 == 1 && iVar8 == 1) {
                      if ((float)(int)local_5c == local_60) {
                        local_ec.type = 0;
                        local_ec.field_1.f = local_5c;
                        std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>::
                        emplace_back<ncnn::typed_value>
                                  ((deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_> *)
                                   local_b8,&local_ec);
                        goto LAB_005bd0ab;
                      }
                    }
                    else if (iVar9 != 1) {
                      eval_list_expression(local_e0);
                      goto LAB_005bd3ac;
                    }
                    local_ec.type = 1;
                    local_ec.field_1.f = local_60;
                    std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>::
                    emplace_back<ncnn::typed_value>
                              ((deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_> *)
                               local_b8,&local_ec);
                  }
                }
LAB_005bd0ab:
                uVar15 = local_d8._0_8_;
              }
            }
          }
        }
        goto LAB_005bc721;
      }
      bVar2 = **(byte **)pnVar14;
      if (9 < (byte)(bVar2 - 0x30)) goto LAB_005bbeed;
      bVar3 = (*(byte **)pnVar14)[1];
      if ((0x14 < bVar3 - 99) || ((0x100023U >> (bVar3 - 99 & 0x1f) & 1) == 0)) goto LAB_005bbeed;
      this_00 = (ncnn *)(ulong)(bVar2 - 0x30);
      pMVar4 = (local_38->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pnVar14 = (ncnn *)(((long)(local_38->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pMVar4 >> 3) *
                        -0x71c71c71c71c71c7);
      if (pnVar14 < this_00 || (long)pnVar14 - (long)this_00 == 0) {
        eval_list_expression(this_00);
LAB_005bd3ac:
        iVar8 = -1;
        goto LAB_005bd37c;
      }
      switch(pMVar4[(long)this_00].dims) {
      case 1:
        aVar12.i = pMVar4[(long)this_00].elempack * pMVar4[(long)this_00].w;
        aVar13.i = 1;
        goto LAB_005bc664;
      case 2:
        aVar12 = (anon_union_4_2_947300a4_for_typed_value_1)pMVar4[(long)this_00].w;
        aVar13.i = pMVar4[(long)this_00].elempack * pMVar4[(long)this_00].h;
LAB_005bc664:
        local_ec.field_1.i = 1;
        aVar17.i = 1;
        break;
      case 3:
        aVar12 = (anon_union_4_2_947300a4_for_typed_value_1)pMVar4[(long)this_00].w;
        aVar13 = (anon_union_4_2_947300a4_for_typed_value_1)pMVar4[(long)this_00].h;
        aVar17.i = pMVar4[(long)this_00].elempack * pMVar4[(long)this_00].c;
        local_ec.field_1.i = 1;
        break;
      case 4:
        aVar12 = (anon_union_4_2_947300a4_for_typed_value_1)pMVar4[(long)this_00].w;
        aVar13 = (anon_union_4_2_947300a4_for_typed_value_1)pMVar4[(long)this_00].h;
        local_ec.field_1 = (anon_union_4_2_947300a4_for_typed_value_1)pMVar4[(long)this_00].d;
        aVar17.i = pMVar4[(long)this_00].elempack * pMVar4[(long)this_00].c;
        break;
      default:
        aVar12.i = 0;
        aVar13.i = 0;
        local_ec.field_1.i = 0;
        aVar17.i = 0;
      }
      if (((bVar3 != 100) && (local_ec.field_1 = aVar13, bVar3 != 0x68)) &&
         (local_ec.field_1 = aVar12, bVar3 != 0x77)) {
        local_ec.field_1 = aVar17;
      }
      local_ec.type = 0;
      std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>::
      emplace_back<ncnn::typed_value>
                ((deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_> *)local_b8,&local_ec)
      ;
LAB_005bc721:
      uVar15 = uVar15 - 1;
      lVar19 = lVar19 + -0x20;
    } while (1 < uVar15);
  }
  if (local_88 == ptStack_80) {
    fVar20 = pptStack_70[-1][0x3f].field_1.f;
    fVar6 = (float)(int)fVar20;
    if (pptStack_70[-1][0x3f].type == 0) {
      fVar6 = fVar20;
    }
    local_ec.type = (int)fVar6;
    operator_delete(ptStack_80,0x200);
    ptStack_80 = pptStack_70[-1];
    local_78 = ptStack_80 + 0x40;
    local_88 = ptStack_80 + 0x3f;
    pptStack_70 = pptStack_70 + -1;
  }
  else {
    ptVar11 = local_88 + -1;
    fVar20 = local_88[-1].field_1.f;
    local_88 = local_88 + -1;
    fVar6 = (float)(int)fVar20;
    local_ec.type = (int)fVar20;
    if (ptVar11->type == 0) {
      fVar6 = fVar20;
      local_ec.type = (int)fVar20;
    }
  }
  this = local_40;
  iVar5._M_current = *(int **)(local_40 + 8);
  if (iVar5._M_current == *(int **)(local_40 + 0x10)) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              (local_40,iVar5,&local_ec.type);
  }
  else {
    *iVar5._M_current = (int)fVar6;
    *(int **)(local_40 + 8) = iVar5._M_current + 1;
  }
  if (local_88 != (_Elt_pointer)local_b8._16_8_) {
    do {
      if (local_88 == ptStack_80) {
        fVar20 = pptStack_70[-1][0x3f].field_1.f;
        local_ec.type = (int)fVar20;
        if (pptStack_70[-1][0x3f].type == 0) {
          local_ec.type = (int)fVar20;
        }
        operator_delete(ptStack_80,0x200);
        ptStack_80 = pptStack_70[-1];
        local_78 = ptStack_80 + 0x40;
        local_88 = ptStack_80 + 0x3f;
        pptStack_70 = pptStack_70 + -1;
      }
      else {
        ptVar11 = local_88 + -1;
        ptVar7 = local_88 + -1;
        local_88 = local_88 + -1;
        local_ec.type = (int)(ptVar7->field_1).f;
        if (ptVar11->type == 0) {
          local_ec.type = (int)(ptVar7->field_1).f;
        }
      }
      iVar5._M_current = *(int **)(this + 8);
      if (iVar5._M_current == *(int **)(this + 0x10)) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (this,iVar5,&local_ec.type);
      }
      else {
        *iVar5._M_current = local_ec.type;
        *(int **)(this + 8) = iVar5._M_current + 1;
      }
    } while (local_88 != (_Elt_pointer)local_b8._16_8_);
  }
  iVar8 = 0;
LAB_005bd37c:
  std::_Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>::~_Deque_base
            ((_Deque_base<ncnn::typed_value,_std::allocator<ncnn::typed_value>_> *)local_b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  return iVar8;
}

Assistant:

int eval_list_expression(const std::string& expr, const std::vector<Mat>& blobs, std::vector<int>& outlist)
{
    // /(0w,2),*(0h,2),0c

    // split by , ( )
    //
    //     /
    //         0w
    //         2
    // -------------------
    //     *
    //         0h
    //         2
    // -------------------
    //     0c
    // -------------------

    // split by , ( )

    // split into tokens
    std::vector<std::string> tokens;
    {
        std::string t;
        for (size_t i = 0; i < expr.size(); i++)
        {
            char ch = expr[i];

            if (ch == '(' || ch == ')' || ch == ',')
            {
                if (!t.empty())
                {
                    tokens.push_back(t);
                    t.clear();
                }
            }
            else
            {
#if NCNN_SIMPLESTL
                t.resize(t.size() + 1);
                t[t.size() - 1] = ch;
#else
                t += ch;
#endif
            }
        }

        if (!t.empty())
        {
            tokens.push_back(t);
        }
    }

    //      / 0w 2 * 0h 2 0c

    // scan and stack
    std::stack<typed_value> exprstack;
    for (int i = (int)tokens.size() - 1; i >= 0; i--)
    {
        const std::string& t = tokens[i];

        // NCNN_LOGE("t = %s", t.c_str());

        // + - * / 0w 0h 0d 0c 12345

        if (t.size() == 2 && (t[0] >= '0' && t[0] <= '9') && (t[1] == 'w' || t[1] == 'h' || t[1] == 'd' || t[1] == 'c'))
        {
            size_t blob_index = t[0] - '0';
            if (blob_index >= blobs.size())
            {
                NCNN_LOGE("shape expression blob index %d out of bound!", (int)blob_index);
                return -1;
            }

            const Mat& blob = blobs[blob_index].shape();
            int size;
            if (t[1] == 'w')
                size = blob.w;
            else if (t[1] == 'h')
                size = blob.h;
            else if (t[1] == 'd')
                size = blob.d;
            else // if (t[1] == 'c')
                size = blob.c;

            // NCNN_LOGE("t = %s  =>  %d", t.c_str(), size);

            exprstack.push(size);
        }
        else if (t == "+" || t == "-" || t == "*" || t == "//" || t == "max" || t == "min")
        {
            typed_value ta = exprstack.top();
            exprstack.pop();
            typed_value tb = exprstack.top();
            exprstack.pop();

            if (ta.type == 0 && tb.type == 0)
            {
                const int a = ta.i;
                const int b = tb.i;

                int r = 0;
                if (t == "+")
                {
                    r = a + b;
                }
                else if (t == "-")
                {
                    r = a - b;
                }
                else if (t == "*")
                {
                    r = a * b;
                }
                else if (t == "//")
                {
                    if (b == 0)
                    {
                        NCNN_LOGE("expr divide by zero");
                        return -1;
                    }
                    else
                    {
                        r = a / b;
                    }
                }
                else if (t == "max")
                {
                    r = std::max(a, b);
                }
                else // if (t == "min")
                {
                    r = std::min(a, b);
                }
                exprstack.push(r);
            }
            else
            {
                const float a = ta.type == 0 ? ta.i : ta.f;
                const float b = tb.type == 0 ? tb.i : tb.f;

                float r = 0.f;
                if (t == "+")
                {
                    r = a + b;
                }
                else if (t == "-")
                {
                    r = a - b;
                }
                else if (t == "*")
                {
                    r = a * b;
                }
                else if (t == "//")
                {
                    r = floorf(a / b);
                }
                else if (t == "max")
                {
                    r = std::max(a, b);
                }
                else // if (t == "min")
                {
                    r = std::min(a, b);
                }
                exprstack.push(r);
            }
        }
        else if (t == "abs" || t == "neg" || t == "sign" || t == "square")
        {
            typed_value ta = exprstack.top();
            exprstack.pop();

            if (ta.type == 0)
            {
                const int a = ta.i;

                int r = 0;
                if (t == "abs")
                {
                    r = a > 0 ? a : -a;
                }
                else if (t == "neg")
                {
                    r = -a;
                }
                else if (t == "sign")
                {
                    r = a > 0 ? 1 : (a == 0 ? 0 : -1);
                }
                else // if (t == "square")
                {
                    r = a * a;
                }
                exprstack.push(r);
            }
            else
            {
                const float a = ta.f;

                float r = 0;
                if (t == "abs")
                {
                    r = fabsf(a);
                }
                else if (t == "neg")
                {
                    r = -a;
                }
                else if (t == "sign")
                {
                    r = a > 0.f ? 1 : (a == 0.f ? 0 : -1);
                }
                else // if (t == "square")
                {
                    r = a * a;
                }
                exprstack.push(r);
            }
        }
        else if (t == "trunc" || t == "ceil" || t == "floor" || t == "round")
        {
            typed_value ta = exprstack.top();
            exprstack.pop();

            if (ta.type == 0)
            {
                const int a = ta.i;
                exprstack.push(a);
            }
            else
            {
                const float a = ta.f;

                int r = 0;
                if (t == "trunc")
                {
                    r = (int)a;
                }
                else if (t == "ceil")
                {
                    r = (int)ceil(a);
                }
                else if (t == "floor")
                {
                    r = (int)floor(a);
                }
                else // if (t == "round")
                {
                    r = (int)round(a);
                }
                exprstack.push(r);
            }
        }
        else if (t == "acos"
                 || t == "acosh"
                 || t == "asin"
                 || t == "asinh"
                 || t == "atan"
                 || t == "atanh"
                 || t == "cos"
                 || t == "cosh"
                 || t == "erf"
                 || t == "exp"
                 || t == "log"
                 || t == "log10"
                 || t == "reciprocal"
                 || t == "rsqrt"
                 || t == "sin"
                 || t == "sinh"
                 || t == "sqrt"
                 || t == "tan"
                 || t == "tanh")
        {
            typed_value ta = exprstack.top();
            exprstack.pop();

            const float a = ta.type == 0 ? ta.i : ta.f;

            float r = 0;
            if (t == "acos")
            {
                r = acosf(a);
            }
            else if (t == "acosh")
            {
                r = acoshf(a);
            }
            else if (t == "asin")
            {
                r = asinf(a);
            }
            else if (t == "asinh")
            {
                r = asinhf(a);
            }
            else if (t == "atan")
            {
                r = atanf(a);
            }
            else if (t == "atanh")
            {
                r = atanhf(a);
            }
            else if (t == "cos")
            {
                r = cosf(a);
            }
            else if (t == "cosh")
            {
                r = coshf(a);
            }
            else if (t == "erf")
            {
                r = erff(a);
            }
            else if (t == "exp")
            {
                r = expf(a);
            }
            else if (t == "log")
            {
                r = logf(a);
            }
            else if (t == "log10")
            {
                r = log10f(a);
            }
            else if (t == "reciprocal")
            {
                r = 1.f / a;
            }
            else if (t == "rsqrt")
            {
                r = 1.f / sqrtf(a);
            }
            else if (t == "sin")
            {
                r = sinf(a);
            }
            else if (t == "sinh")
            {
                r = sinhf(a);
            }
            else if (t == "sqrt")
            {
                r = sqrtf(a);
            }
            else if (t == "tan")
            {
                r = tanf(a);
            }
            else // if (t == "tanh")
            {
                r = tanhf(a);
            }
            exprstack.push(r);
        }
        else if (t == "/"
                 || t == "atan2"
                 || t == "fmod"
                 || t == "pow"
                 || t == "remainder"
                 || t == "logaddexp")
        {
            typed_value ta = exprstack.top();
            exprstack.pop();
            typed_value tb = exprstack.top();
            exprstack.pop();

            const float a = ta.type == 0 ? ta.i : ta.f;
            const float b = tb.type == 0 ? tb.i : tb.f;

            float r = 0.f;
            if (t == "/")
            {
                r = a / b;
            }
            else if (t == "atan2")
            {
                r = atan2f(a, b);
            }
            else if (t == "fmod")
            {
                r = fmodf(a, b);
            }
            else if (t == "pow")
            {
                r = powf(a, b);
            }
            else if (t == "remainder")
            {
                r = fmodf(a, b);
                if (a * b < 0)
                    r += b;
            }
            else // if (t == "logaddexp")
            {
                r = logf(expf(a) + expf(b));
            }
            exprstack.push(r);
        }
        else if (t == "and" || t == "or" || t == "xor" || t == "lshift" || t == "rshift")
        {
            typed_value ta = exprstack.top();
            exprstack.pop();
            typed_value tb = exprstack.top();
            exprstack.pop();

            // assert ta.type == 0 && tb.type == 0

            const int a = ta.i;
            const int b = tb.i;

            int r = 0;
            if (t == "and")
            {
                r = a & b;
            }
            else if (t == "or")
            {
                r = a | b;
            }
            else if (t == "xor")
            {
                r = a ^ b;
            }
            else if (t == "lshift")
            {
                r = a << b;
            }
            else // if (t == "rshift")
            {
                r = a >> b;
            }
            exprstack.push(r);
        }
        else
        {
            // literal
            int vi;
            float vf;
            int nscani = sscanf(t.c_str(), "%d", &vi);
            int nscanf = sscanf(t.c_str(), "%f", &vf);
            if (nscani == 1 && nscanf == 1 && vi == vf)
            {
                exprstack.push(vi);
            }
            else if (nscanf == 1)
            {
                exprstack.push(vf);
            }
            else
            {
                NCNN_LOGE("malformed literal token %s", t.c_str());
                return -1;
            }
        }
    }

    int size = exprstack.top().to_int();
    exprstack.pop();
    outlist.push_back(size);
    while (!exprstack.empty())
    {
        size = exprstack.top().to_int();
        exprstack.pop();
        outlist.push_back(size);
    }

    // NCNN_LOGE("shape %s = %d %d", expr.c_str(), list[0], list[1]);

    return 0;
}